

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall BCLog::Logger::DisableLogging(Logger *this)

{
  long lVar1;
  uint __line;
  char *__assertion;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock((mutex *)this);
  if (this->m_buffering == false) {
    __assertion = "m_buffering";
    __line = 0x71;
  }
  else {
    if ((this->m_print_callbacks).
        super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
        ._M_impl._M_node.super__List_node_base._M_next ==
        (_List_node_base *)&this->m_print_callbacks) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      this->m_print_to_console = false;
      this->m_print_to_file = false;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        StartLogging(this);
        return;
      }
      __stack_chk_fail();
    }
    __assertion = "m_print_callbacks.empty()";
    __line = 0x72;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                ,__line,"void BCLog::Logger::DisableLogging()");
}

Assistant:

void BCLog::Logger::DisableLogging()
{
    {
        StdLockGuard scoped_lock(m_cs);
        assert(m_buffering);
        assert(m_print_callbacks.empty());
    }
    m_print_to_file = false;
    m_print_to_console = false;
    StartLogging();
}